

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Optimisations.h
# Opt level: O1

Statement * __thiscall soul::Optimisations::Inliner::cloneStatement(Inliner *this,Statement *s)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar2;
  Statement *pSVar3;
  void *in_R8;
  undefined1 auVar4 [16];
  
  iVar1 = 0;
  auVar4 = __dynamic_cast(s,&heart::Statement::typeinfo,&heart::AssignFromValue::typeinfo);
  if (auVar4._0_8_ == (__fn *)0x0) {
    iVar1 = 0;
    auVar4 = __dynamic_cast(s,&heart::Statement::typeinfo,&heart::FunctionCall::typeinfo);
    if (auVar4._0_8_ == (__fn *)0x0) {
      iVar1 = 0;
      auVar4 = __dynamic_cast(s,&heart::Statement::typeinfo,&heart::ReadStream::typeinfo);
      if (auVar4._0_8_ == (__fn *)0x0) {
        iVar1 = 0;
        auVar4 = __dynamic_cast(s,&heart::Statement::typeinfo,&heart::WriteStream::typeinfo);
        if (auVar4._0_8_ == (__fn *)0x0) {
          lVar2 = __dynamic_cast(s,&heart::Statement::typeinfo,&heart::AdvanceClock::typeinfo,0);
          if (lVar2 == 0) {
            throwInternalCompilerError("cloneStatement",0x261);
          }
          pSVar3 = &PoolAllocator::allocate<soul::heart::AdvanceClock,soul::CodeLocation_const&>
                              (&this->module->allocator->pool,(CodeLocation *)(lVar2 + 8))->
                    super_Statement;
        }
        else {
          iVar1 = clone(this,auVar4._0_8_,auVar4._8_8_,iVar1,in_R8);
          pSVar3 = (Statement *)CONCAT44(extraout_var_02,iVar1);
        }
      }
      else {
        iVar1 = clone(this,auVar4._0_8_,auVar4._8_8_,iVar1,in_R8);
        pSVar3 = (Statement *)CONCAT44(extraout_var_01,iVar1);
      }
    }
    else {
      iVar1 = clone(this,auVar4._0_8_,auVar4._8_8_,iVar1,in_R8);
      pSVar3 = (Statement *)CONCAT44(extraout_var_00,iVar1);
    }
  }
  else {
    iVar1 = clone(this,auVar4._0_8_,auVar4._8_8_,iVar1,in_R8);
    pSVar3 = (Statement *)CONCAT44(extraout_var,iVar1);
  }
  return pSVar3;
}

Assistant:

heart::Statement& cloneStatement (heart::Statement& s)
        {
            #define SOUL_CLONE_STATEMENT(Type)     if (auto t = cast<const heart::Type> (s)) return clone (*t);
            SOUL_HEART_STATEMENTS (SOUL_CLONE_STATEMENT)
            #undef SOUL_CLONE_STATEMENT
            SOUL_ASSERT_FALSE;
            return s;
        }